

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall
node::BlockManager::UpdateBlockInfo(BlockManager *this,CBlock *block,uint nHeight,FlatFilePos *pos)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  BlockfileCursor *pBVar4;
  size_type sVar5;
  uint *puVar6;
  reference pvVar7;
  int *in_RCX;
  long in_FS_OFFSET;
  uint added_size;
  value_type *cursor;
  BlockfileType chain_type;
  int nFile;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  CBlockHeader *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint uVar8;
  uint in_stack_ffffffffffffff24;
  CBlockFileInfo *in_stack_ffffffffffffff28;
  BlockManager *in_stack_ffffffffffffff30;
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
  BlockfileTypeForHeight(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
            ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_ffffffffffffff28,
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional<node::BlockfileCursor> *)in_stack_ffffffffffffff18);
  if ((!bVar3) ||
     (pBVar4 = std::optional<node::BlockfileCursor>::operator->
                         ((optional<node::BlockfileCursor> *)in_stack_ffffffffffffff18),
     pBVar4->file_num < *in_RCX)) {
    std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
              ((array<std::optional<node::BlockfileCursor>,_2UL> *)in_stack_ffffffffffffff28,
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    std::optional<node::BlockfileCursor>::operator=
              ((optional<node::BlockfileCursor> *)in_stack_ffffffffffffff28,
               (BlockfileCursor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_ffffffffffffff28,
             (CBlock *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
            ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar1 = *in_RCX;
  sVar5 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::size
                    ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                     in_stack_ffffffffffffff18);
  if ((int)sVar5 <= iVar1) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
  }
  std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)in_stack_ffffffffffffff28,
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  CBlockHeader::GetBlockTime(in_stack_ffffffffffffff18);
  CBlockFileInfo::AddBlock
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,(uint64_t)in_stack_ffffffffffffff18
            );
  std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
            ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)in_stack_ffffffffffffff28,
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  puVar6 = std::max<unsigned_int>
                     ((uint *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (uint *)in_stack_ffffffffffffff18);
  uVar8 = *puVar6;
  pvVar7 = std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                     ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                      in_stack_ffffffffffffff28,CONCAT44(in_stack_ffffffffffffff24,uVar8));
  pvVar7->nSize = uVar8;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffff28,
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff24,uVar8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::UpdateBlockInfo(const CBlock& block, unsigned int nHeight, const FlatFilePos& pos)
{
    LOCK(cs_LastBlockFile);

    // Update the cursor so it points to the last file.
    const BlockfileType chain_type{BlockfileTypeForHeight(nHeight)};
    auto& cursor{m_blockfile_cursors[chain_type]};
    if (!cursor || cursor->file_num < pos.nFile) {
        m_blockfile_cursors[chain_type] = BlockfileCursor{pos.nFile};
    }

    // Update the file information with the current block.
    const unsigned int added_size = ::GetSerializeSize(TX_WITH_WITNESS(block));
    const int nFile = pos.nFile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }
    m_blockfile_info[nFile].AddBlock(nHeight, block.GetBlockTime());
    m_blockfile_info[nFile].nSize = std::max(pos.nPos + added_size, m_blockfile_info[nFile].nSize);
    m_dirty_fileinfo.insert(nFile);
}